

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImFormatStringV(char *buf,size_t buf_size,char *fmt,__va_list_tag *args)

{
  int local_34;
  int w;
  __va_list_tag *args_local;
  char *fmt_local;
  size_t buf_size_local;
  char *buf_local;
  
  local_34 = vsnprintf(buf,buf_size,fmt,args);
  buf_local._4_4_ = local_34;
  if (buf != (char *)0x0) {
    if ((local_34 == -1) || ((int)buf_size <= local_34)) {
      local_34 = (int)buf_size + -1;
    }
    buf[local_34] = '\0';
    buf_local._4_4_ = local_34;
  }
  return buf_local._4_4_;
}

Assistant:

int ImFormatStringV(char* buf, size_t buf_size, const char* fmt, va_list args)
{
#ifdef IMGUI_USE_STB_SPRINTF
    int w = stbsp_vsnprintf(buf, (int)buf_size, fmt, args);
#else
    int w = vsnprintf(buf, buf_size, fmt, args);
#endif
    if (buf == NULL)
        return w;
    if (w == -1 || w >= (int)buf_size)
        w = (int)buf_size - 1;
    buf[w] = 0;
    return w;
}